

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

void __thiscall HighsCutGeneration::flipComplementation(HighsCutGeneration *this,HighsInt index)

{
  double dVar1;
  pointer puVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  puVar2 = (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2[index] = '\x01' - puVar2[index];
  pdVar3 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4[index] = pdVar3[index] - pdVar4[index];
  pdVar5 = this->vals;
  dVar6 = pdVar3[index] * pdVar5[index];
  dVar1 = (this->rhs).hi;
  dVar7 = dVar1 - dVar6;
  (this->rhs).hi = dVar7;
  (this->rhs).lo = (dVar1 - (dVar6 + dVar7)) + (-dVar6 - (dVar7 - (dVar6 + dVar7))) + (this->rhs).lo
  ;
  pdVar5[index] = -pdVar5[index];
  return;
}

Assistant:

void HighsCutGeneration::flipComplementation(HighsInt index) {
  // only variables with finite upper bounds can be complemented
  assert(upper[index] != kHighsInf);

  // flip complementation
  complementation[index] = 1 - complementation[index];
  solval[index] = upper[index] - solval[index];
  rhs -= upper[index] * vals[index];
  vals[index] = -vals[index];
}